

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QPageSize * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,PageSizeId pageSizeId)

{
  bool bVar1;
  PageSizeId PVar2;
  QPageSize *pQVar3;
  PageSizeId in_EDX;
  QPlatformPrintDevice *in_RSI;
  QPageSize *in_RDI;
  long in_FS_OFFSET;
  QPageSize *ps;
  add_const_t<QList<QPageSize>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QPageSize *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  QPageSize local_28 [8];
  QPageSize *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((in_RSI->m_havePageSizes & 1U) == 0) {
    (*in_RSI->_vptr_QPlatformPrintDevice[0x26])();
  }
  local_10.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QPageSize>::begin(this_00);
  local_18.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QPageSize>::end(this_00);
  do {
    local_20 = local_18.i;
    bVar1 = QList<QPageSize>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) {
      QPageSize::QPageSize(local_28,in_EDX);
      supportedPageSizeMatch(in_RSI,(QPageSize *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0));
      QPageSize::~QPageSize(local_28);
LAB_00132257:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return this_00;
      }
      __stack_chk_fail();
    }
    pQVar3 = QList<QPageSize>::const_iterator::operator*(&local_10);
    PVar2 = QPageSize::id();
    if (PVar2 == in_EDX) {
      QPageSize::QPageSize(in_RDI,pQVar3);
      goto LAB_00132257;
    }
    QList<QPageSize>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(QPageSize::PageSizeId pageSizeId) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.id() == pageSizeId)
            return ps;
    }

    // If no supported page size found, try use a custom size instead if supported
    return supportedPageSizeMatch(QPageSize(pageSizeId));
}